

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O0

void __thiscall ON_NurbsSurface::Dump(ON_NurbsSurface *this,ON_TextLog *dump)

{
  int dim;
  int iVar1;
  int count;
  int stride;
  uint uVar2;
  double *P;
  char *pcVar3;
  undefined8 in_stack_ffffffffffffff08;
  size_t sPremable_capacity;
  char sPreamble [128];
  uint local_20;
  uint local_1c;
  int i;
  int dir;
  ON_TextLog *dump_local;
  ON_NurbsSurface *this_local;
  
  ON_TextLog::Print(dump,
                    "ON_NurbsSurface dim = %d is_rat = %d\n        order = %d X %d cv_count = %d X %d\n"
                    ,(ulong)(uint)this->m_dim,(ulong)(uint)this->m_is_rat,
                    (ulong)(uint)this->m_order[0],(ulong)(uint)this->m_order[1],
                    CONCAT44((int)((ulong)in_stack_ffffffffffffff08 >> 0x20),this->m_cv_count[0]),
                    this->m_cv_count[1]);
  for (local_1c = 0; (int)local_1c < 2; local_1c = local_1c + 1) {
    uVar2 = KnotCount(this,local_1c);
    ON_TextLog::Print(dump,"Knot Vector %d ( %d knots )\n",(ulong)local_1c,(ulong)uVar2);
    ON_TextLog::PrintKnotVector
              (dump,this->m_order[(int)local_1c],this->m_cv_count[(int)local_1c],
               this->m_knot[(int)local_1c]);
  }
  pcVar3 = "non-rational";
  if (this->m_is_rat != 0) {
    pcVar3 = "rational";
  }
  ON_TextLog::Print(dump,"Control Points  %d %s points\n  index               value\n",
                    (ulong)(uint)(this->m_cv_count[0] * this->m_cv_count[1]),pcVar3);
  if (this->m_cv == (double *)0x0) {
    ON_TextLog::Print(dump,"  nullptr cv array\n");
  }
  else {
    memset(&sPremable_capacity,0,0x80);
    for (local_20 = 0; (int)local_20 < this->m_cv_count[0]; local_20 = local_20 + 1) {
      if (0 < (int)local_20) {
        ON_TextLog::Print(dump,"\n");
      }
      sPremable_capacity._0_1_ = 0;
      ON_String::FormatIntoBuffer((char *)&sPremable_capacity,0x80,"  CV[%2d]",(ulong)local_20);
      dim = this->m_dim;
      iVar1 = this->m_is_rat;
      count = this->m_cv_count[1];
      stride = this->m_cv_stride[1];
      P = CV(this,local_20,0);
      ON_TextLog::PrintPointList(dump,dim,iVar1 != 0,count,stride,P,(char *)&sPremable_capacity);
    }
  }
  return;
}

Assistant:

void ON_NurbsSurface::Dump( ON_TextLog& dump ) const
{
  dump.Print( "ON_NurbsSurface dim = %d is_rat = %d\n"
               "        order = %d X %d cv_count = %d X %d\n",
               m_dim, m_is_rat, m_order[0], m_order[1], m_cv_count[0], m_cv_count[1] );
  int dir;
  for ( dir = 0; dir < 2; dir++ ) 
  {
    dump.Print( "Knot Vector %d ( %d knots )\n", dir, KnotCount(dir) );
    dump.PrintKnotVector( m_order[dir], m_cv_count[dir], m_knot[dir] );
  }

  dump.Print( "Control Points  %d %s points\n"
               "  index               value\n",
               m_cv_count[0]*m_cv_count[1], 
               (m_is_rat) ? "rational" : "non-rational" );
  if ( !m_cv ) 
  {
    dump.Print("  nullptr cv array\n");
  }
  else 
  {
    int i;
    char sPreamble[128] = { 0 };
    const size_t sPremable_capacity = sizeof(sPreamble) / sizeof(sPreamble[0]);
    for ( i = 0; i < m_cv_count[0]; i++ )
    {
      if ( i > 0 )
        dump.Print("\n");
      sPreamble[0] = 0;
      ON_String::FormatIntoBuffer(sPreamble, sPremable_capacity,"  CV[%2d]", i);
      dump.PrintPointList( m_dim, m_is_rat, 
                        m_cv_count[1], m_cv_stride[1],
                        CV(i,0), 
                        sPreamble );
    }
  }
}